

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

uint16_t addip_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  ushort uVar1;
  int iVar2;
  uint32_t t_1;
  uint32_t t;
  size_t ib;
  size_t ia;
  uint16_t carry;
  uint32_t mask;
  size_t nb_local;
  size_t na_local;
  uint16_t *b_local;
  uint16_t *a_local;
  
  ia._2_2_ = 0;
  _t_1 = nb;
  ib = na;
  while( true ) {
    if (_t_1 == 0) {
      for (; ib != 0 && ia._2_2_ != 0; ia._2_2_ = (ushort)((uint)uVar1 + (uint)ia._2_2_ >> 0x10)) {
        ib = ib - 1;
        uVar1 = a[ib];
        a[ib] = (uint16_t)((uint)uVar1 + (uint)ia._2_2_);
      }
      return ia._2_2_;
    }
    if (ib == 0) break;
    ib = ib - 1;
    _t_1 = _t_1 - 1;
    iVar2 = (uint)a[ib] + (uint)b[_t_1] + (uint)ia._2_2_;
    a[ib] = (uint16_t)iVar2;
    ia._2_2_ = (ushort)((uint)iVar2 >> 0x10);
  }
  __assert_fail("ia",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                ,0x486,"uint16_t addip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
}

Assistant:

static uint16_t addip_u16n(uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	uint16_t carry = 0;
	size_t ia = na, ib = nb;

	while (ib > 0) {
		uint32_t t;

		assert(ia);
		--ia;
		--ib;
		t = (uint32_t)a[ia] + (uint32_t)b[ib] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	while (ia > 0 && carry) {
		uint32_t t;

		--ia;
		t = (uint32_t)a[ia] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	return carry;
}